

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool __thiscall ON_ArcCurve::SetEndPoint(ON_ArcCurve *this,ON_3dPoint end_point)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  double *pdVar4;
  ON_3dPoint *p;
  ON_3dVector *a_00;
  double in_XMM1_Qa;
  ON_3dVector local_180;
  ON_3dVector local_168;
  ON_Interval local_150;
  undefined1 local_140 [8];
  ON_3dPoint start_point;
  undefined1 local_118 [8];
  ON_Arc a;
  double t;
  ON_3dVector T;
  ON_3dPoint P;
  bool rc;
  ON_ArcCurve *this_local;
  
  bVar3 = ON_Curve::SetEndPoint(&this->super_ON_Curve,end_point);
  if (bVar3) {
    return true;
  }
  bVar3 = IsCircle(this);
  if (bVar3) {
    return false;
  }
  P.z._7_1_ = false;
  if (this->m_dim != 3) {
    in_XMM1_Qa = 0.0;
    if ((end_point.z != 0.0) || (NAN(end_point.z))) goto LAB_0047385c;
  }
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pdVar4 = ON_Interval::operator[]((ON_Interval *)(a.m_angle.m_t + 1),0);
  ON_Curve::Ev1Der(&this->super_ON_Curve,*pdVar4,(ON_3dPoint *)&T.z,(ON_3dVector *)&t,0,(int *)0x0);
  ON_Arc::ON_Arc((ON_Arc *)local_118);
  P.z._7_1_ = ON_Arc::Create((ON_Arc *)local_118,(ON_3dPoint *)&T.z,(ON_3dVector *)&t,&end_point);
  if (P.z._7_1_) {
    memcpy(&this->m_arc,local_118,0x98);
  }
  else {
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
    local_150.m_t[1] = in_XMM1_Qa;
    pdVar4 = ON_Interval::operator[](&local_150,0);
    ON_Curve::PointAt((ON_3dPoint *)local_140,&this->super_ON_Curve,*pdVar4);
    dVar1 = ON_3dPoint::DistanceTo(&end_point,(ON_3dPoint *)local_140);
    dVar2 = ON_Circle::Radius(&(this->m_arc).super_ON_Circle);
    if (dVar1 < dVar2 * 2.3283064365386963e-10) {
      p = ON_Circle::Center(&(this->m_arc).super_ON_Circle);
      ON_3dPoint::operator-(&local_168,(ON_3dPoint *)local_140,p);
      (this->m_arc).super_ON_Circle.plane.xaxis.z = local_168.z;
      (this->m_arc).super_ON_Circle.plane.xaxis.x = local_168.x;
      (this->m_arc).super_ON_Circle.plane.xaxis.y = local_168.y;
      ON_3dVector::Unitize(&(this->m_arc).super_ON_Circle.plane.xaxis);
      a_00 = ON_Circle::Normal(&(this->m_arc).super_ON_Circle);
      ON_CrossProduct(&local_180,a_00,&(this->m_arc).super_ON_Circle.plane.xaxis);
      (this->m_arc).super_ON_Circle.plane.yaxis.z = local_180.z;
      (this->m_arc).super_ON_Circle.plane.yaxis.x = local_180.x;
      (this->m_arc).super_ON_Circle.plane.yaxis.y = local_180.y;
      ON_3dVector::Unitize(&(this->m_arc).super_ON_Circle.plane.yaxis);
      ON_Arc::SetAngleRadians(&this->m_arc,6.283185307179586);
      P.z._7_1_ = true;
    }
  }
  ON_Arc::~ON_Arc((ON_Arc *)local_118);
LAB_0047385c:
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return P.z._7_1_;
}

Assistant:

bool ON_ArcCurve::SetEndPoint(ON_3dPoint end_point)
{
  if (ON_Curve::SetEndPoint(end_point))
    return true;
  if (IsCircle())
    return false;
  bool rc = false;
  if ( m_dim == 3 || end_point.z == 0.0 )
  {
    ON_3dPoint P;
    ON_3dVector T;
    double t = Domain()[0];
    Ev1Der( t, P, T );
    ON_Arc a;
    rc = a.Create( P, T, end_point );
    if ( rc )
    {
      m_arc = a;
    }
    else {
      ON_3dPoint start_point = PointAt(Domain()[0]);
      if (end_point.DistanceTo(start_point) < ON_ZERO_TOLERANCE*m_arc.Radius()){
        //make arc into circle
        m_arc.plane.xaxis = start_point - m_arc.Center();
        m_arc.plane.xaxis.Unitize();
        m_arc.plane.yaxis = ON_CrossProduct(m_arc.Normal(), m_arc.plane.xaxis);
        m_arc.plane.yaxis.Unitize();
        m_arc.SetAngleRadians(2.0*ON_PI);
        rc = true;
      }
    }
  }
	DestroyCurveTree();
  return rc;  
}